

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block_builder.cc
# Opt level: O2

void __thiscall leveldb::BlockBuilder::Add(BlockBuilder *this,Slice *key,Slice *value)

{
  string *dst;
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  uint local_34;
  
  if (this->counter_ < this->options_->block_restart_interval) {
    uVar2 = (this->last_key_)._M_string_length;
    uVar4 = key->size_;
    if (uVar4 < uVar2) {
      uVar2 = uVar4;
    }
    for (uVar1 = 0;
        (uVar3 = uVar2, uVar2 != uVar1 &&
        (uVar3 = uVar1, (this->last_key_)._M_dataplus._M_p[uVar1] == key->data_[uVar1]));
        uVar1 = uVar1 + 1) {
    }
  }
  else {
    local_34 = (uint)(this->buffer_)._M_string_length;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::emplace_back<unsigned_int>
              (&this->restarts_,&local_34);
    this->counter_ = 0;
    uVar4 = key->size_;
    uVar3 = 0;
  }
  dst = &this->buffer_;
  PutVarint32(dst,(uint32_t)uVar3);
  PutVarint32(dst,(int)uVar4 - (uint32_t)uVar3);
  PutVarint32(dst,(uint32_t)value->size_);
  std::__cxx11::string::append((char *)dst,(ulong)(key->data_ + uVar3));
  std::__cxx11::string::append((char *)dst,(ulong)value->data_);
  std::__cxx11::string::resize((ulong)&this->last_key_);
  std::__cxx11::string::append((char *)&this->last_key_,(ulong)(key->data_ + uVar3));
  this->counter_ = this->counter_ + 1;
  return;
}

Assistant:

void BlockBuilder::Add(const Slice& key, const Slice& value) {
  Slice last_key_piece(last_key_);
  assert(!finished_);
  assert(counter_ <= options_->block_restart_interval);
  assert(buffer_.empty()  // No values yet?
         || options_->comparator->Compare(key, last_key_piece) > 0);
  size_t shared = 0;
  if (counter_ < options_->block_restart_interval) {
    // See how much sharing to do with previous string
    const size_t min_length = std::min(last_key_piece.size(), key.size());
    while ((shared < min_length) && (last_key_piece[shared] == key[shared])) {
      shared++;
    }
  } else {
    // Restart compression
    restarts_.push_back((uint32_t)buffer_.size());
    counter_ = 0;
  }
  const size_t non_shared = key.size() - shared;

  // Add "<shared><non_shared><value_size>" to buffer_
  PutVarint32(&buffer_, (uint32_t)shared);
  PutVarint32(&buffer_, (uint32_t)non_shared);
  PutVarint32(&buffer_, (uint32_t)value.size());

  // Add string delta to buffer_ followed by value
  buffer_.append(key.data() + shared, non_shared);
  buffer_.append(value.data(), value.size());

  // Update state
  last_key_.resize(shared);
  last_key_.append(key.data() + shared, non_shared);
  assert(Slice(last_key_) == key);
  counter_++;
}